

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O3

void __thiscall exe_reconstructor::o32exe::appendexedata(o32exe *this,ByteVector *hdr)

{
  pointer puVar1;
  pointer pcVar2;
  ulong uVar3;
  undefined8 *puVar4;
  size_t __len;
  long lVar5;
  
  if ((this->name)._M_string_length < 8) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (hdr,(size_type)
                   ((hdr->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                    .super__Vector_impl_data._M_finish +
                   (0x28 - (long)(hdr->
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                 _M_impl.super__Vector_impl_data._M_start)));
    puVar1 = (hdr->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    uVar3 = (this->name)._M_string_length;
    if (0 < (long)uVar3) {
      pcVar2 = (this->name)._M_dataplus._M_p;
      uVar3 = uVar3 + 1;
      lVar5 = 0;
      do {
        puVar1[lVar5 + -0x28] = pcVar2[lVar5];
        uVar3 = uVar3 - 1;
        lVar5 = lVar5 + 1;
      } while (1 < uVar3);
      uVar3 = (this->name)._M_string_length;
    }
    if (uVar3 < 8) {
      memset(puVar1 + (uVar3 - 0x28),0,8 - uVar3);
    }
    *(uint32_t *)(puVar1 + -0x20) = this->vsize;
    *(uint32_t *)(puVar1 + -0x1c) = this->rva;
    *(uint32_t *)(puVar1 + -0x18) = this->psize;
    *(uint32_t *)(puVar1 + -0x14) = this->dataptr;
    *(uint32_t *)(puVar1 + -0x10) = this->realaddr;
    *(uint32_t *)(puVar1 + -0xc) = this->access;
    *(uint32_t *)(puVar1 + -8) = this->temp3;
    *(uint32_t *)(puVar1 + -4) = this->flags;
    return;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = "section name > 8 chars";
  __cxa_throw(puVar4,&char_const*::typeinfo,0);
}

Assistant:

void appendexedata(ByteVector& hdr)
        {
            if (name.size()>=8)
                throw "section name > 8 chars";

            hdr.resize(hdr.size()+o32exe::size());
            uint8_t *p= &hdr[hdr.size()-o32exe::size()];
            std::copy(name.begin(), name.end(), p);
            if (name.size()<8)
                std::fill_n(p+name.size(), 8-name.size(), uint8_t(0));

            set32le(p+0x0008, vsize);
            set32le(p+0x000c, rva);
            set32le(p+0x0010, psize);
            set32le(p+0x0014, dataptr);
            set32le(p+0x0018, realaddr);
            set32le(p+0x001c, access);
            set32le(p+0x0020, temp3);
            set32le(p+0x0024, flags);
        }